

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O0

void __thiscall CTPNStmExprBase::gen_code(CTPNStmExprBase *this,int param_2,int param_3)

{
  _func_int **pp_Var1;
  CTcTokenizer *this_00;
  CTcTokFileDesc *desc;
  long linenum;
  CTPNStmBase *in_RDI;
  
  this_00 = G_tok;
  desc = CTPNStmBase::get_source_desc(in_RDI);
  linenum = CTPNStmBase::get_source_linenum(in_RDI);
  CTcTokenizer::set_line_info(this_00,desc,linenum);
  CTPNStmBase::add_debug_line_rec(in_RDI);
  pp_Var1 = in_RDI[1].super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase;
  (**(code **)*pp_Var1)(pp_Var1,1);
  return;
}

Assistant:

void CTPNStmExprBase::gen_code(int, int)
{
    /* set our location for any errors that occur */
    G_tok->set_line_info(get_source_desc(), get_source_linenum());

    /* add a debug line record for the statement */
    add_debug_line_rec();

    /* 
     *   generate code in our expression - the result will not be used in any
     *   further calculation, so discard it; and since we don't care about
     *   the return value, use the looser "for condition" rules for any
     *   top-level logical operators in the expression so that we don't
     *   bother applying any extra conversions to a value we're just
     *   discarding anyway 
     */
    expr_->gen_code(TRUE, TRUE);
}